

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O0

char * ODDLParser::OpenDDLParser::parseDataList
                 (char *in,char *end,ValueType type,Value **data,size_t *numValues,Reference **refs,
                 size_t *numRefs)

{
  Reference *this;
  size_type sVar1;
  reference names_00;
  bool bVar2;
  Reference *ref;
  undefined1 local_68 [8];
  vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> names;
  Value *prev;
  Value *current;
  Reference **refs_local;
  size_t *numValues_local;
  Value **data_local;
  char *pcStack_20;
  ValueType type_local;
  char *end_local;
  char *in_local;
  
  *data = (Value *)0x0;
  *numRefs = 0;
  *numValues = 0;
  in_local = in;
  if ((in != (char *)0x0) && (in != end)) {
    current = (Value *)refs;
    refs_local = (Reference **)numValues;
    numValues_local = (size_t *)data;
    data_local._4_4_ = type;
    pcStack_20 = end;
    end_local = in;
    end_local = lookForNextToken<char>(in,end);
    if ((end_local != pcStack_20) && (*end_local == '{')) {
      end_local = end_local + 1;
      names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      while( true ) {
        bVar2 = false;
        if (end_local != pcStack_20) {
          bVar2 = *end_local != '}';
        }
        if (!bVar2) break;
        prev = (Value *)0x0;
        end_local = lookForNextToken<char>(end_local,pcStack_20);
        if (data_local._4_4_ == ddl_ref) {
          std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::vector
                    ((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)local_68);
          end_local = parseReference(end_local,pcStack_20,
                                     (vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                      *)local_68);
          bVar2 = std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::empty
                            ((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)
                             local_68);
          if (!bVar2) {
            this = (Reference *)operator_new(0x10);
            sVar1 = std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::size
                              ((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)
                               local_68);
            names_00 = std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::
                       operator[]((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *
                                  )local_68,0);
            Reference::Reference(this,sVar1,names_00);
            *(Reference **)current = this;
            sVar1 = std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::size
                              ((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)
                               local_68);
            *numRefs = sVar1;
          }
          std::vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>::~vector
                    ((vector<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_> *)local_68);
        }
        else if (data_local._4_4_ == ddl_none) {
          bVar2 = isInteger<char>(end_local,pcStack_20);
          if (bVar2) {
            end_local = parseIntegerLiteral(end_local,pcStack_20,&prev,ddl_int32);
          }
          else {
            bVar2 = isFloat<char>(end_local,pcStack_20);
            if (bVar2) {
              end_local = parseFloatingLiteral(end_local,pcStack_20,&prev,ddl_float);
            }
            else {
              bVar2 = isStringLiteral<char>(*end_local);
              if (bVar2) {
                end_local = parseStringLiteral(end_local,pcStack_20,&prev);
              }
              else {
                bVar2 = isHexLiteral<char>(end_local,pcStack_20);
                if (bVar2) {
                  end_local = parseHexaLiteral(end_local,pcStack_20,&prev);
                }
              }
            }
          }
        }
        else if ((uint)(data_local._4_4_ + ddl_none) < 8) {
          end_local = parseIntegerLiteral(end_local,pcStack_20,&prev,data_local._4_4_);
        }
        else if ((uint)(data_local._4_4_ + ~ddl_unsigned_int64) < 3) {
          end_local = parseFloatingLiteral(end_local,pcStack_20,&prev,data_local._4_4_);
        }
        else if (data_local._4_4_ == ddl_string) {
          end_local = parseStringLiteral(end_local,pcStack_20,&prev);
        }
        if (prev != (Value *)0x0) {
          if (*numValues_local == 0) {
            *numValues_local = (size_t)prev;
          }
          else {
            Value::setNext((Value *)names.
                                    super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,prev);
          }
          *refs_local = (Reference *)((long)&(*refs_local)->m_numRefs + 1);
          names.super__Vector_base<ODDLParser::Name_*,_std::allocator<ODDLParser::Name_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)prev;
        }
        end_local = getNextSeparator<char>(end_local,pcStack_20);
        if ((end_local == pcStack_20) ||
           (((*end_local != ',' && (*Grammar::CloseBracketToken != *end_local)) &&
            (bVar2 = isSpace<char>(*end_local), !bVar2)))) break;
      }
      if (end_local != pcStack_20) {
        end_local = end_local + 1;
      }
    }
    in_local = end_local;
  }
  return in_local;
}

Assistant:

char *OpenDDLParser::parseDataList(char *in, char *end, Value::ValueType type, Value **data,
        size_t &numValues, Reference **refs, size_t &numRefs) {
    *data = nullptr;
    numValues = numRefs = 0;
    if (nullptr == in || in == end) {
        return in;
    }

    in = lookForNextToken(in, end);
    if (in != end && *in == '{') {
        ++in;
        Value *current(nullptr), *prev(nullptr);
        while (in != end && '}' != *in) {
            current = nullptr;
            in = lookForNextToken(in, end);
            if (Value::ValueType::ddl_ref == type) {
                std::vector<Name *> names;
                in = parseReference(in, end, names);
                if (!names.empty()) {
                    Reference *ref = new Reference(names.size(), &names[0]);
                    *refs = ref;
                    numRefs = names.size();
                }
            } else if (Value::ValueType::ddl_none == type) {
                if (isInteger(in, end)) {
                    in = parseIntegerLiteral(in, end, &current);
                } else if (isFloat(in, end)) {
                    in = parseFloatingLiteral(in, end, &current);
                } else if (isStringLiteral(*in)) {
                    in = parseStringLiteral(in, end, &current);
                } else if (isHexLiteral(in, end)) {
                    in = parseHexaLiteral(in, end, &current);
                }
            } else {
                switch (type) {
                    case Value::ValueType::ddl_int8:
                    case Value::ValueType::ddl_int16:
                    case Value::ValueType::ddl_int32:
                    case Value::ValueType::ddl_int64:
                    case Value::ValueType::ddl_unsigned_int8:
                    case Value::ValueType::ddl_unsigned_int16:
                    case Value::ValueType::ddl_unsigned_int32:
                    case Value::ValueType::ddl_unsigned_int64:
                        in = parseIntegerLiteral(in, end, &current, type);
                        break;
                    case Value::ValueType::ddl_half:
                    case Value::ValueType::ddl_float:
                    case Value::ValueType::ddl_double:
                        in = parseFloatingLiteral(in, end, &current, type);
                        break;
                    case Value::ValueType::ddl_string:
                        in = parseStringLiteral(in, end, &current);
                        break;
                    default:
                        break;
                }
            }

            if (nullptr != current) {
                if (nullptr == *data) {
                    *data = current;
                    prev = current;
                } else {
                    prev->setNext(current);
                    prev = current;
                }
                ++numValues;
            }

            in = getNextSeparator(in, end);
            if (in == end || (',' != *in && Grammar::CloseBracketToken[0] != *in && !isSpace(*in))) {
                break;
            }
        }
        if (in != end)
            ++in;
    }

    return in;
}